

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSize __thiscall
QDockAreaLayout::size_helper<QSize(QDockAreaLayoutInfo::*)()const,QSize(QLayoutItem::*)()const>
          (QDockAreaLayout *this,offset_in_QDockAreaLayoutInfo_to_subr sizeFn,
          offset_in_QLayoutItem_to_subr centerFn)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  code *in_RCX;
  int iVar10;
  int iVar11;
  Representation RVar12;
  QSize QVar13;
  int iVar14;
  Representation RVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  QLayoutItem *pQVar19;
  int iVar20;
  long in_R8;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  int local_64;
  code *pcVar6;
  
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    iVar14 = 0;
    iVar22 = 0;
    local_64 = 0;
    iVar11 = 0;
  }
  else {
    bVar2 = QDockAreaLayoutInfo::isEmpty(this->docks);
    iVar22 = 0;
    iVar11 = 0;
    if (!bVar2) {
      iVar11 = this->sep;
    }
    bVar2 = QDockAreaLayoutInfo::isEmpty(this->docks + 1);
    local_64 = 0;
    if (!bVar2) {
      local_64 = this->sep;
    }
    bVar2 = QDockAreaLayoutInfo::isEmpty(this->docks + 2);
    iVar14 = 0;
    if (!bVar2) {
      iVar14 = this->sep;
    }
    bVar2 = QDockAreaLayoutInfo::isEmpty(this->docks + 3);
    if (!bVar2) {
      iVar22 = this->sep;
    }
  }
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[0].sep + centerFn) + -1 + sizeFn);
  }
  uVar3 = (*pcVar6)();
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[1].sep + centerFn) + -1 + sizeFn);
  }
  uVar4 = (*pcVar6)();
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[2].sep + centerFn) + -1 + sizeFn);
  }
  uVar5 = (*pcVar6)();
  if ((sizeFn & 1) != 0) {
    sizeFn = *(undefined8 *)(*(long *)((long)&this->docks[3].sep + centerFn) + -1 + sizeFn);
  }
  uVar7 = (*(code *)sizeFn)();
  pQVar19 = this->centralWidgetItem;
  iVar23 = 0;
  iVar18 = 0;
  iVar9 = 0;
  uVar8 = 0;
  if (pQVar19 != (QLayoutItem *)0x0) {
    pQVar19 = (QLayoutItem *)((long)&pQVar19->_vptr_QLayoutItem + in_R8);
    if (((ulong)in_RCX & 1) != 0) {
      in_RCX = *(code **)(in_RCX + (long)pQVar19->_vptr_QLayoutItem + -1);
    }
    uVar8 = (*in_RCX)();
    iVar9 = (int)((ulong)uVar8 >> 0x20);
  }
  iVar22 = iVar22 + (int)((ulong)uVar7 >> 0x20);
  iVar14 = iVar14 + (int)((ulong)uVar5 >> 0x20);
  local_64 = local_64 + (int)uVar4;
  iVar11 = iVar11 + (int)uVar3;
  auVar24._0_4_ = -(uint)(this->corners[0] == LeftDockWidgetArea);
  auVar24._4_4_ = -(uint)(this->corners[1] == RightDockWidgetArea);
  auVar24._8_4_ = -(uint)(this->corners[2] == LeftDockWidgetArea);
  auVar24._12_4_ = -(uint)(this->corners[3] == RightDockWidgetArea);
  uVar17 = movmskps((int)pQVar19,auVar24);
  iVar20 = iVar14;
  iVar1 = 0;
  if ((uVar17 & 1) != 0) {
    iVar20 = iVar18;
    iVar1 = iVar11;
  }
  iVar21 = iVar14;
  iVar10 = 0;
  if ((uVar17 & 2) != 0) {
    iVar21 = iVar18;
    iVar10 = local_64;
  }
  iVar10 = iVar10 + iVar1 + (int)uVar5;
  iVar16 = iVar22;
  iVar1 = 0;
  if ((uVar17 & 4) != 0) {
    iVar16 = iVar18;
    iVar1 = iVar11;
  }
  iVar16 = iVar16 + iVar20 + (int)((ulong)uVar3 >> 0x20);
  iVar18 = local_64;
  if ((uVar17 & 8) == 0) {
    iVar23 = iVar22;
    iVar18 = 0;
  }
  iVar18 = iVar18 + iVar1 + (int)uVar7;
  iVar23 = iVar23 + iVar21 + (int)((ulong)uVar4 >> 0x20);
  RVar15.m_i = iVar14 + iVar22 + iVar9;
  RVar12.m_i = iVar11 + local_64 + (int)uVar8;
  if (RVar12.m_i <= iVar18) {
    RVar12.m_i = iVar18;
  }
  if (RVar12.m_i <= iVar10) {
    RVar12.m_i = iVar10;
  }
  if (RVar15.m_i <= iVar23) {
    RVar15.m_i = iVar23;
  }
  if (RVar15.m_i <= iVar16) {
    RVar15.m_i = iVar16;
  }
  QVar13.ht.m_i = RVar15.m_i;
  QVar13.wd.m_i = RVar12.m_i;
  return QVar13;
}

Assistant:

QSize QDockAreaLayout::size_helper(SizePMF sizeFn, CenterPMF centerFn) const
{
    int left_sep = 0;
    int right_sep = 0;
    int top_sep = 0;
    int bottom_sep = 0;

    if (centralWidgetItem != nullptr) {
        left_sep = docks[QInternal::LeftDock].isEmpty() ? 0 : sep;
        right_sep = docks[QInternal::RightDock].isEmpty() ? 0 : sep;
        top_sep = docks[QInternal::TopDock].isEmpty() ? 0 : sep;
        bottom_sep = docks[QInternal::BottomDock].isEmpty() ? 0 : sep;
    }

    const QSize left = (docks[QInternal::LeftDock].*sizeFn)() + QSize(left_sep, 0);
    const QSize right = (docks[QInternal::RightDock].*sizeFn)() + QSize(right_sep, 0);
    const QSize top = (docks[QInternal::TopDock].*sizeFn)() + QSize(0, top_sep);
    const QSize bottom = (docks[QInternal::BottomDock].*sizeFn)() + QSize(0, bottom_sep);
    const QSize center = centralWidgetItem == nullptr
                       ? QSize(0, 0) : (centralWidgetItem->*centerFn)();

    int row1 = top.width();
    int row2 = left.width() + center.width() + right.width();
    int row3 = bottom.width();
    int col1 = left.height();
    int col2 = top.height() + center.height() + bottom.height();
    int col3 = right.height();

    if (corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea)
        row1 += left.width();
    else
        col1 += top.height();

    if (corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea)
        row1 += right.width();
    else
        col3 += top.height();

    if (corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea)
        row3 += left.width();
    else
        col1 += bottom.height();

    if (corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea)
        row3 += right.width();
    else
        col3 += bottom.height();

    return QSize(qMax(row1, row2, row3), qMax(col1, col2, col3));
}